

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Vdbe * sqlite3VdbeCreate(sqlite3 *db)

{
  Vdbe *p;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)sqlite3DbMallocZero(db,0x110);
  if (db_local == (sqlite3 *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local->pVfs = (sqlite3_vfs *)db;
    if (db->pVdbe != (Vdbe *)0x0) {
      db->pVdbe->pPrev = (Vdbe *)db_local;
    }
    *(Vdbe **)db_local->aLimit = db->pVdbe;
    *(Vdbe **)&db_local->nChange = (Vdbe *)0x0;
    db->pVdbe = (Vdbe *)db_local;
    *(u32 *)&db_local->mallocFailed = 0x26bceaa5;
  }
  return (Vdbe *)db_local;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(sqlite3 *db){
  Vdbe *p;
  p = sqlite3DbMallocZero(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->pPrev = p;
  }
  p->pNext = db->pVdbe;
  p->pPrev = 0;
  db->pVdbe = p;
  p->magic = VDBE_MAGIC_INIT;
  return p;
}